

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_boost_po::options_boost_po
          (options_boost_po *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_options_i)._vptr_options_i = (_func_int **)&PTR_add_and_parse_002d2248;
  p_Var1 = &(this->m_options)._M_t._M_impl.super__Rb_tree_header;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_command_line,args);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_help_stringstream);
  p_Var1 = &(this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header;
  (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_ignore_supplied)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  boost::program_options::options_description::options_description
            (&this->master_description,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  p_Var1 = &(this->m_defined_options)._M_t._M_impl.super__Rb_tree_header;
  (this->m_defined_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_defined_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_defined_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_defined_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_defined_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

options_boost_po(std::vector<std::string> args) : m_command_line(args) {}